

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.cc
# Opt level: O0

int CRYPTO_refcount_dec_and_test_zero(CRYPTO_refcount_t *in_count)

{
  bool bVar1;
  uint32_t desired;
  uint32_t local_24;
  uint32_t new_value;
  uint32_t expected;
  CRYPTO_atomic_u32 *count;
  CRYPTO_refcount_t *in_count_local;
  
  _new_value = (CRYPTO_atomic_u32 *)in_count;
  count = (CRYPTO_atomic_u32 *)in_count;
  local_24 = CRYPTO_atomic_load_u32((CRYPTO_atomic_u32 *)in_count);
  while( true ) {
    if (local_24 == 0) {
      abort();
    }
    if (local_24 == 0xffffffff) break;
    desired = local_24 - 1;
    bVar1 = CRYPTO_atomic_compare_exchange_weak_u32(_new_value,&local_24,desired);
    if (bVar1) {
      return (uint)(desired == 0);
    }
  }
  return 0;
}

Assistant:

int CRYPTO_refcount_dec_and_test_zero(CRYPTO_refcount_t *in_count) {
  CRYPTO_atomic_u32 *count = (CRYPTO_atomic_u32 *)in_count;
  uint32_t expected = CRYPTO_atomic_load_u32(count);

  for (;;) {
    if (expected == 0) {
      abort();
    } else if (expected == CRYPTO_REFCOUNT_MAX) {
      return 0;
    } else {
      const uint32_t new_value = expected - 1;
      if (CRYPTO_atomic_compare_exchange_weak_u32(count, &expected,
                                                  new_value)) {
        return new_value == 0;
      }
    }
  }
}